

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O1

void LabelDict::free_label_features(label_feature_map *lfm)

{
  float *__ptr;
  unsigned_long *__ptr_00;
  hash_elem *phVar1;
  
  phVar1 = (lfm->dat)._begin;
  while( true ) {
    if (phVar1 == (lfm->dat).end_array) goto LAB_002470ee;
    if (phVar1->occupied != false) break;
    phVar1 = phVar1 + 1;
  }
LAB_002470f1:
  do {
    if (phVar1 == (hash_elem *)0x0) {
      if (lfm->num_occupants != 0) {
        phVar1 = (lfm->dat)._begin;
        memset(phVar1,0,(long)(lfm->dat).end_array - (long)phVar1);
        lfm->last_position = 0;
        lfm->num_occupants = 0;
      }
      phVar1 = (lfm->dat)._begin;
      if (phVar1 != (hash_elem *)0x0) {
        free(phVar1);
      }
      (lfm->dat)._begin = (hash_elem *)0x0;
      (lfm->dat)._end = (hash_elem *)0x0;
      (lfm->dat).end_array = (hash_elem *)0x0;
      return;
    }
    __ptr = (phVar1->val).values._begin;
    if (__ptr != (float *)0x0) {
      free(__ptr);
    }
    (phVar1->val).values._begin = (float *)0x0;
    (phVar1->val).values._end = (float *)0x0;
    (phVar1->val).values.end_array = (float *)0x0;
    __ptr_00 = (phVar1->val).indicies._begin;
    if (__ptr_00 != (unsigned_long *)0x0) {
      free(__ptr_00);
    }
    (phVar1->val).indicies._begin = (unsigned_long *)0x0;
    (phVar1->val).indicies._end = (unsigned_long *)0x0;
    (phVar1->val).indicies.end_array = (unsigned_long *)0x0;
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::delete_v(&(phVar1->val).space_names);
    do {
      phVar1 = phVar1 + 1;
      if (phVar1 == (lfm->dat).end_array) goto LAB_002470ee;
    } while (phVar1->occupied != true);
  } while( true );
LAB_002470ee:
  phVar1 = (hash_elem *)0x0;
  goto LAB_002470f1;
}

Assistant:

void free_label_features(label_feature_map& lfm)
{
  void* label_iter = lfm.iterator();
  while (label_iter != nullptr)
  {
    features* res = lfm.iterator_get_value(label_iter);
    res->values.delete_v();
    res->indicies.delete_v();
    res->space_names.delete_v();

    label_iter = lfm.iterator_next(label_iter);
  }
  lfm.clear();
  lfm.delete_v();
}